

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O0

void xemmai::t_code::f_try(t_context *a_context)

{
  void **ppvVar1;
  void **ppvVar2;
  void **ppvVar3;
  int iVar4;
  size_t sVar5;
  void **return0;
  void **continue0;
  void **break0;
  t_rvalue *thrown_1;
  size_t index;
  t_pvalue type;
  void **caught;
  t_fiber *p;
  t_rvalue *thrown;
  t_try try0;
  void **finally0;
  void **catch0;
  t_pvalue *stack;
  t_pvalue *base;
  void ***pc;
  t_context *a_context_local;
  
  a_context->v_pc = a_context->v_pc + 1;
  a_context->v_pc = a_context->v_pc + 1;
  ppvVar1 = a_context->v_pc;
  a_context->v_pc = ppvVar1 + 1;
  ppvVar1 = (void **)ppvVar1[1];
  a_context->v_pc = a_context->v_pc + 1;
  sVar5 = f_loop(a_context,(void ***)0x0);
  iVar4 = (int)sVar5;
  a_context->v_pc = ppvVar1;
  f_loop(a_context,(void ***)0x0);
  ppvVar1 = a_context->v_pc;
  a_context->v_pc = ppvVar1 + 1;
  ppvVar1 = (void **)ppvVar1[1];
  ppvVar2 = a_context->v_pc;
  a_context->v_pc = ppvVar2 + 1;
  ppvVar2 = (void **)ppvVar2[1];
  ppvVar3 = a_context->v_pc;
  a_context->v_pc = ppvVar3 + 1;
  if (iVar4 == 2) {
    a_context->v_pc = ppvVar1;
  }
  else if (iVar4 == 3) {
    a_context->v_pc = ppvVar2;
  }
  else if (iVar4 == 4) {
    a_context->v_pc = (void **)ppvVar3[1];
  }
  else {
    a_context->v_pc = a_context->v_pc + 1;
  }
  return;
}

Assistant:

void t_code::f_try(t_context* a_context)
{
	auto& pc = a_context->v_pc;
	auto base = a_context->v_base;
	auto stack = base + reinterpret_cast<size_t>(*++pc);
	auto catch0 = static_cast<void**>(*++pc);
	auto finally0 = static_cast<void**>(*++pc);
	++pc;
	t_try try0;
	try {
		try {
			try0 = static_cast<t_try>(f_loop(a_context));
		} catch (...) {
			f_rethrow();
		}
	} catch (const t_rvalue& thrown) {
		auto& p = t_fiber::f_current()->f_as<t_fiber>();
		void** caught = p.v_caught == nullptr ? pc : p.v_caught;
		p.v_caught = nullptr;
		pc = catch0;
		while (true) {
			try {
				try {
					try0 = static_cast<t_try>(f_loop(a_context));
					if (try0 != c_try__CATCH) break;
					++pc;
					auto type = stack[0];
					f_check<t_type>(type, L"type");
					if (thrown != f_engine()->v_fiber_exit && thrown.f_is(&type->f_as<t_type>())) {
						auto index = reinterpret_cast<size_t>(*++pc);
						++pc;
						p.f_caught(thrown, a_context->v_lambda, caught);
						if ((index & ~(~0 >> 1)) != 0)
							a_context->v_scope->f_as<t_scope>().f_entries()[~index] = thrown;
						else
							base[index] = thrown;
					} else {
						pc = static_cast<void**>(*pc);
					}
				} catch (...) {
					f_rethrow();
				}
			} catch (const t_rvalue& thrown) {
				caught = p.v_caught == nullptr ? pc : p.v_caught;
				p.v_caught = nullptr;
				pc = finally0;
				f_loop(a_context);
				p.v_caught = caught;
				throw thrown;
			}
		}
		if (try0 == c_try__THROW) {
			pc = finally0;
			f_loop(a_context);
			p.v_caught = caught;
			throw thrown;
		}
	}
	pc = finally0;
	f_loop(a_context);
	auto break0 = static_cast<void**>(*++pc);
	auto continue0 = static_cast<void**>(*++pc);
	auto return0 = static_cast<void**>(*++pc);
	switch (try0) {
	case c_try__BREAK:
		pc = break0;
		break;
	case c_try__CONTINUE:
		pc = continue0;
		break;
	case c_try__RETURN:
		pc = return0;
		break;
	default:
		++pc;
	}
}